

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perceptron.cpp
# Opt level: O2

void __thiscall
PyreNet::Perceptron::calculate
          (Perceptron *this,vector<double,_std::allocator<double>_> *input,Activation *activation)

{
  uint uVar1;
  pointer pdVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double extraout_XMM0_Qa;
  
  pdVar2 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = this->inputSize;
  if ((long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 == (long)(int)uVar1) {
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    dVar6 = 0.0;
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      dVar6 = dVar6 + pdVar2[uVar5] *
                      (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar5];
    }
    (**activation->_vptr_Activation)
              (dVar6 + (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1],activation);
    this->cachedValue = extraout_XMM0_Qa;
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_0010dca8;
  __cxa_throw(puVar3,&InvalidInputSize::typeinfo,std::exception::~exception);
}

Assistant:

void Perceptron::calculate(const std::vector<double> &input, Activation *activation) {
        if (input.size() != this->inputSize) {
            throw InvalidInputSize();
        }
        double weightedSum = 0;
        for (int i = 0; i < this->inputSize; i++) {
            weightedSum += input[i] * this->weights[i];
        }
        weightedSum += 1 * this->weights.back(); // bias term
        this->cachedValue = activation->activate(weightedSum);
    }